

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

TypeMetaFunction * __thiscall
soul::StructuralParser::parseTypeMetaFunction(StructuralParser *this,Context *context,Op op)

{
  Expression *args_1;
  TypeMetaFunction *pTVar1;
  Op local_24;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
  args_1 = parseType(this,metaFunctionArgument);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
  pTVar1 = PoolAllocator::
           allocate<soul::AST::TypeMetaFunction,soul::AST::Context_const&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
                     (&this->allocator->pool,context,args_1,&local_24);
  return pTVar1;
}

Assistant:

AST::TypeMetaFunction& parseTypeMetaFunction (const AST::Context& context, AST::TypeMetaFunction::Op op)
    {
        expect (Operator::openParen);
        auto& t = parseType (ParseTypeContext::metaFunctionArgument);
        expect (Operator::closeParen);
        return allocate<AST::TypeMetaFunction> (context, t, op);
    }